

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  runtime_error *this_00;
  uint uVar2;
  
  if ((other->index_ == 0) || (__s = other->cstr_, __s == (char *)0x0)) {
    __dest = other->cstr_;
  }
  else {
    sVar1 = strlen(__s);
    uVar2 = 0x7ffffffe;
    if ((uint)sVar1 < 0x7ffffffe) {
      uVar2 = (uint)sVar1;
    }
    __dest = (char *)malloc((ulong)(uVar2 + 1));
    if (__dest == (char *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Failed to allocate string value buffer");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    memcpy(__dest,__s,(ulong)uVar2);
    __dest[uVar2] = '\0';
  }
  this->cstr_ = __dest;
  uVar2 = (uint)(other->index_ != 0);
  if (other->cstr_ == (char *)0x0) {
    uVar2 = other->index_;
  }
  this->index_ = uVar2;
  return;
}

Assistant:

Value::CZString::CZString( const CZString &other )
: cstr_( other.index_ != noDuplication &&  other.cstr_ != 0
                ?  duplicateStringValue( other.cstr_ )
                : other.cstr_ )
   , index_( other.cstr_ ? (other.index_ == noDuplication ? noDuplication : duplicate)
                         : other.index_ )
{
}